

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyNPY.cpp
# Opt level: O1

type_info * NpyArray::getTypeInfo(char t,size_t s)

{
  undefined3 in_register_00000039;
  
  switch(CONCAT31(in_register_00000039,t)) {
  case 0x62:
    return (type_info *)&bool::typeinfo;
  case 99:
    if (s == 8) {
      return (type_info *)&std::complex<float>::typeinfo;
    }
    if (s == 0x20) {
      return (type_info *)&std::complex<long_double>::typeinfo;
    }
    if (s == 0x10) {
      return (type_info *)&std::complex<double>::typeinfo;
    }
    break;
  case 100:
  case 0x65:
  case 0x67:
  case 0x68:
    break;
  case 0x66:
    if (s == 4) {
      return (type_info *)&float::typeinfo;
    }
    if (s == 0x10) {
      return (type_info *)&long_double::typeinfo;
    }
    if (s == 8) {
      return (type_info *)&double::typeinfo;
    }
    break;
  case 0x69:
    switch(s) {
    case 1:
      return (type_info *)&char::typeinfo;
    case 2:
      return (type_info *)&short::typeinfo;
    case 3:
    case 5:
    case 6:
    case 7:
      break;
    case 4:
      return (type_info *)&int::typeinfo;
    case 8:
      return (type_info *)&long::typeinfo;
    default:
      if (s == 0x10) {
        return (type_info *)&long_long::typeinfo;
      }
    }
    break;
  default:
    if (CONCAT31(in_register_00000039,t) == 0x75) {
      switch(s) {
      case 1:
        return (type_info *)&unsigned_char::typeinfo;
      case 2:
        return (type_info *)&unsigned_short::typeinfo;
      case 3:
      case 5:
      case 6:
      case 7:
        break;
      case 4:
        return (type_info *)&unsigned_int::typeinfo;
      case 8:
        return (type_info *)&unsigned_long::typeinfo;
      default:
        if (s == 0x10) {
          return (type_info *)&unsigned_long_long::typeinfo;
        }
      }
    }
  }
  return (type_info *)&void::typeinfo;
}

Assistant:

const std::type_info& NpyArray::getTypeInfo(char t, size_t s)
{
	switch (t) {
	case 'f': switch (s) {
		case  4: return typeid(float);
		case  8: return typeid(double);
		case 16: return typeid(long double);
		} break;
	case 'i': switch (s) {
		case  1: return typeid(char);
		case  2: return typeid(short);
		case  4: return typeid(int);
		case  8: return typeid(long);
		case 16: return typeid(long long);
		} break;
	case 'u': switch (s) {
		case  1: return typeid(unsigned char);
		case  2: return typeid(unsigned short);
		case  4: return typeid(unsigned int);
		case  8: return typeid(unsigned long);
		case 16: return typeid(unsigned long long);
		} break;
	case 'c': switch (s) {
		case  8: return typeid(std::complex<float>);
		case 16: return typeid(std::complex<double>);
		case 32: return typeid(std::complex<long double>);
		} break;
	case 'b': return typeid(bool);
	}
	return typeid(void);
}